

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O0

void __thiscall BeliefSparse::BeliefSparse(BeliefSparse *this,StateDistribution *belief)

{
  undefined8 in_RSI;
  BeliefInterface *in_RDI;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_00000020;
  
  BeliefInterface::BeliefInterface(in_RDI);
  in_RDI->_vptr_BeliefInterface = (_func_int **)&PTR__BeliefSparse_00d31dd0;
  in_RDI->_vptr_BeliefInterface = (_func_int **)&PTR__BeliefSparse_00d31dd0;
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::compressed_vector(in_stack_00000020);
  (*in_RDI->_vptr_BeliefInterface[5])(in_RDI,in_RSI);
  return;
}

Assistant:

BeliefSparse::BeliefSparse(const StateDistribution& belief)
{
    this->Set(belief);
}